

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O3

void __thiscall QProxyStylePrivate::ensureBaseStyle(QProxyStylePrivate *this)

{
  QPointer<QStyle> *pQVar1;
  QStyle *style;
  Data *pDVar2;
  int iVar3;
  QObject *pQVar4;
  Data *pDVar5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  style = *(QStyle **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x8;
  pDVar5 = (this->baseStyle).wp.d;
  pQVar1 = &this->baseStyle;
  if (pDVar5 == (Data *)0x0) {
LAB_00347d04:
    if (_topLevelAt == 0) goto LAB_00347db5;
    pQVar4 = &QStyleFactory::create((QString *)&QGuiApplicationPrivate::styleOverride)->
              super_QObject;
    if (pQVar4 == (QObject *)0x0) {
      pDVar5 = (Data *)0x0;
    }
    else {
      pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
    }
    pDVar2 = (this->baseStyle).wp.d;
    (this->baseStyle).wp.d = pDVar5;
    (this->baseStyle).wp.value = pQVar4;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
      pDVar5 = (pQVar1->wp).d;
    }
    if ((pDVar5 == (Data *)0x0) ||
       (pQVar4 = (this->baseStyle).wp.value, pQVar4 == (QObject *)0x0 || *(int *)(pDVar5 + 4) == 0))
    goto LAB_00347db5;
    (*(code *)**(undefined8 **)pQVar4)();
    pcVar6 = (char *)QMetaObject::className();
    (*(code *)**(undefined8 **)style)(style);
    pcVar7 = (char *)QMetaObject::className();
    iVar3 = qstrcmp(pcVar6,pcVar7);
    if (iVar3 != 0) goto LAB_00347db5;
    pDVar5 = (pQVar1->wp).d;
    if (pDVar5 != (Data *)0x0) {
      if ((*(int *)(pDVar5 + 4) == 0) ||
         (pQVar4 = (this->baseStyle).wp.value, pQVar4 == (QObject *)0x0)) {
        (pQVar1->wp).d = (Data *)0x0;
        (this->baseStyle).wp.value = (QObject *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
        pDVar5 = (pQVar1->wp).d;
        (pQVar1->wp).d = (Data *)0x0;
        (this->baseStyle).wp.value = (QObject *)0x0;
        if (pDVar5 == (Data *)0x0) goto LAB_00347dcf;
      }
      LOCK();
      *(int *)pDVar5 = *(int *)pDVar5 + -1;
      UNLOCK();
      if (*(int *)pDVar5 == 0) {
        operator_delete(pDVar5);
      }
      goto LAB_00347db5;
    }
    (pQVar1->wp).d = (Data *)0x0;
    (this->baseStyle).wp.value = (QObject *)0x0;
LAB_00347dcf:
    QApplicationPrivate::desktopStyleKey();
    pQVar4 = &QStyleFactory::create(&local_48)->super_QObject;
    if (pQVar4 == (QObject *)0x0) {
      pDVar5 = (Data *)0x0;
    }
    else {
      pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
    }
    pDVar2 = (this->baseStyle).wp.d;
    (this->baseStyle).wp.d = pDVar5;
    (this->baseStyle).wp.value = pQVar4;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar5 = (pQVar1->wp).d;
    if (pDVar5 != (Data *)0x0) goto LAB_00347e48;
LAB_00347e65:
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar8);
    local_68.d.d = local_48.d.d;
    local_68.d.ptr = local_48.d.ptr;
    local_68.d.size = local_48.d.size;
    pQVar4 = &QStyleFactory::create(&local_68)->super_QObject;
    if (pQVar4 == (QObject *)0x0) {
      pDVar5 = (Data *)0x0;
    }
    else {
      pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
    }
    pDVar2 = (this->baseStyle).wp.d;
    (this->baseStyle).wp.d = pDVar5;
    (this->baseStyle).wp.value = pQVar4;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (this->baseStyle).wp.value;
  }
  else {
    pQVar4 = (this->baseStyle).wp.value;
    if (*(int *)(pDVar5 + 4) != 0 && pQVar4 != (QObject *)0x0) goto LAB_00347f20;
    if (*(int *)(pDVar5 + 4) == 0 || pQVar4 == (QObject *)0x0) goto LAB_00347d04;
LAB_00347db5:
    pDVar5 = (pQVar1->wp).d;
    if (((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) ||
       ((this->baseStyle).wp.value == (QObject *)0x0)) goto LAB_00347dcf;
LAB_00347e48:
    pQVar4 = (this->baseStyle).wp.value;
    if (*(int *)(pDVar5 + 4) == 0 || pQVar4 == (QObject *)0x0) goto LAB_00347e65;
  }
  QStyle::setProxy((QStyle *)pQVar4,style);
  QObject::setParent((this->baseStyle).wp.value);
LAB_00347f20:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProxyStylePrivate::ensureBaseStyle() const
{
    Q_Q(const QProxyStyle);

    if (baseStyle)
        return;

    if (!baseStyle && !QApplicationPrivate::styleOverride.isEmpty()) {
        baseStyle = QStyleFactory::create(QApplicationPrivate::styleOverride);
        if (baseStyle) {
            // If baseStyle is an instance of the same proxyStyle
            // we destroy it and fall back to the desktop style
            if (qstrcmp(baseStyle->metaObject()->className(),
                        q->metaObject()->className()) == 0) {
                delete baseStyle;
                baseStyle = nullptr;
            }
        }
    }

    if (!baseStyle) // Use application desktop style
        baseStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());

    if (!baseStyle) // Fallback to windows style
        baseStyle = QStyleFactory::create("windows"_L1);

    baseStyle->setProxy(const_cast<QProxyStyle*>(q));
    baseStyle->setParent(const_cast<QProxyStyle*>(q)); // Take ownership
}